

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request_queue_impl_qwqr.cpp
# Opt level: O0

bool __thiscall
foxxll::file_offset_match::operator()(file_offset_match *this,request_ptr *a,request_ptr *b)

{
  request *prVar1;
  offset_type oVar2;
  offset_type oVar3;
  file *pfVar4;
  file *pfVar5;
  undefined1 local_21;
  request_ptr *b_local;
  request_ptr *a_local;
  file_offset_match *this_local;
  
  prVar1 = tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::operator->(a);
  oVar2 = request::offset(prVar1);
  prVar1 = tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::operator->(b);
  oVar3 = request::offset(prVar1);
  local_21 = false;
  if (oVar2 == oVar3) {
    prVar1 = tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::operator->(a);
    pfVar4 = request::get_file(prVar1);
    prVar1 = tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::operator->(b);
    pfVar5 = request::get_file(prVar1);
    local_21 = pfVar4 == pfVar5;
  }
  return local_21;
}

Assistant:

bool operator () (
        const request_ptr& a,
        const request_ptr& b) const
    {
        // matching file and offset are enough to cause problems
        return (a->offset() == b->offset()) &&
               (a->get_file() == b->get_file());
    }